

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTIN.cpp
# Opt level: O1

string * ZXing::GTIN::IssueNr(string *__return_storage_ptr__,string *ean2AddOn)

{
  int iVar1;
  char *__nptr;
  uint uVar2;
  char *in_RAX;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  uint __val;
  uint uVar8;
  uint __len;
  char *local_38;
  
  if (ean2AddOn->_M_string_length != 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  __nptr = (ean2AddOn->_M_dataplus)._M_p;
  local_38 = in_RAX;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar8 = (uint)lVar4;
    if (((int)uVar8 == lVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      __val = -uVar8;
      if (0 < (int)uVar8) {
        __val = uVar8;
      }
      __len = 1;
      if (9 < __val) {
        uVar7 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar6 = (uint)uVar7;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_00135993;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_00135993;
          }
          if (uVar6 < 10000) goto LAB_00135993;
          uVar7 = uVar7 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar6);
        __len = __len + 1;
      }
LAB_00135993:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct
                ((ulong)__return_storage_ptr__,(char)__len - ((char)((ulong)lVar4 >> 0x18) >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar8 >> 0x1f),__len,__val);
      return __return_storage_ptr__;
    }
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = iVar1;
  }
  _Unwind_Resume(uVar5);
}

Assistant:

std::string IssueNr(const std::string& ean2AddOn)
{
	if (ean2AddOn.size() != 2)
		return {};

	return std::to_string(std::stoi(ean2AddOn));
}